

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O1

uint __thiscall
llvm::MCRegisterInfo::getSubRegIndex(MCRegisterInfo *this,MCRegister Reg,MCRegister SubReg)

{
  uint uVar1;
  uint16_t *puVar2;
  ushort *puVar3;
  short *psVar4;
  undefined1 local_40 [8];
  MCSubRegIterator Subs;
  
  if ((SubReg.Reg != 0) && (SubReg.Reg < this->NumRegs)) {
    if (this->NumRegs <= Reg.Reg) {
      __assert_fail("RegNo < NumRegs && \"Attempting to access record for invalid register number!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/MC/MCRegisterInfo.h"
                    ,0x14b,
                    "const MCRegisterDesc &llvm::MCRegisterInfo::operator[](MCRegister) const");
    }
    puVar2 = this->SubRegIndices;
    uVar1 = this->Desc[Reg.Reg].SubRegIndices;
    MCSubRegIterator::MCSubRegIterator((MCSubRegIterator *)local_40,Reg,this,false);
    if (Subs.super_DiffListIterator._0_8_ != 0) {
      puVar3 = puVar2 + uVar1;
      do {
        if ((ushort)local_40._0_2_ == SubReg.Reg) {
          return (uint)*puVar3;
        }
        psVar4 = (short *)(Subs.super_DiffListIterator._0_8_ + 2);
        local_40._0_2_ = local_40._0_2_ + *(short *)Subs.super_DiffListIterator._0_8_;
        if (*(short *)Subs.super_DiffListIterator._0_8_ == 0) {
          psVar4 = (short *)0x0;
        }
        puVar3 = puVar3 + 1;
        Subs.super_DiffListIterator._0_8_ = psVar4;
      } while (psVar4 != (short *)0x0);
    }
    return 0;
  }
  __assert_fail("SubReg && SubReg < getNumRegs() && \"This is not a register\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/MCRegisterInfo.cpp"
                ,0x2e,
                "unsigned int llvm::MCRegisterInfo::getSubRegIndex(MCRegister, MCRegister) const");
}

Assistant:

unsigned MCRegisterInfo::getSubRegIndex(MCRegister Reg,
                                        MCRegister SubReg) const {
  assert(SubReg && SubReg < getNumRegs() && "This is not a register");
  // Get a pointer to the corresponding SubRegIndices list. This list has the
  // name of each sub-register in the same order as MCSubRegIterator.
  const uint16_t *SRI = SubRegIndices + get(Reg).SubRegIndices;
  for (MCSubRegIterator Subs(Reg, this); Subs.isValid(); ++Subs, ++SRI)
    if (*Subs == SubReg)
      return *SRI;
  return 0;
}